

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamReaderPrivate::QXmlStreamReaderPrivate(QXmlStreamReaderPrivate *this,QXmlStreamReader *q)

{
  QLatin1StringView value;
  QLatin1StringView value_00;
  QLatin1StringView value_01;
  QLatin1StringView value_02;
  QLatin1StringView value_03;
  QLatin1StringView name;
  QLatin1StringView name_00;
  QLatin1StringView name_01;
  QLatin1StringView name_02;
  QLatin1StringView name_03;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *ctx;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  piter pVar1;
  Entity e_4;
  Entity e_3;
  Entity e_2;
  Entity e_1;
  Entity e;
  QStringView *in_stack_fffffffffffffc08;
  QXmlStreamReaderPrivate *in_stack_fffffffffffffc10;
  Entity *this_00;
  QString *in_stack_fffffffffffffc18;
  QXmlStreamPrivateTagStack *in_stack_fffffffffffffc78;
  qsizetype in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *puVar2;
  QXmlStreamEntityDeclarations *pQVar3;
  QString local_148;
  undefined1 *puStack_130;
  undefined1 *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = in_RSI;
  QXmlStreamPrivateTagStack::QXmlStreamPrivateTagStack(in_stack_fffffffffffffc78);
  in_RDI->q_ptr = (QXmlStreamReader *)in_RSI;
  QByteArray::QByteArray((QByteArray *)0x647f16);
  QByteArray::QByteArray((QByteArray *)0x647f2f);
  QString::QString((QString *)0x647f4b);
  QXmlStreamSimpleStack<unsigned_int>::QXmlStreamSimpleStack(&in_RDI->putStack);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::QHash(&in_RDI->entityHash);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::QHash(&in_RDI->parameterEntityHash);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::QEntityReference>::QXmlStreamSimpleStack
            (&in_RDI->entityReferenceStack);
  in_RDI->entityExpansionLimit = 0x1000;
  in_RDI->entityLength = 0;
  QStringDecoder::QStringDecoder((QStringDecoder *)0x647fef);
  in_RDI->currentContext = Prolog;
  in_RDI->foundDTD = false;
  QString::QString((QString *)0x64801c);
  QString::QString((QString *)0x648038);
  QXmlStreamAttributes::QXmlStreamAttributes((QXmlStreamAttributes *)0x648054);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->lastAttributeValue);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute>::QXmlStreamSimpleStack
            (&in_RDI->dtdAttributes);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration>::QXmlStreamSimpleStack
            (&in_RDI->notationDeclarations);
  QList<QXmlStreamNotationDeclaration>::QList((QList<QXmlStreamNotationDeclaration> *)0x6480c2);
  QList<QXmlStreamNamespaceDeclaration>::QList((QList<QXmlStreamNamespaceDeclaration> *)0x6480de);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration>::QXmlStreamSimpleStack
            (&in_RDI->entityDeclarations);
  pQVar3 = &in_RDI->publicEntityDeclarations;
  QList<QXmlStreamEntityDeclaration>::QList((QList<QXmlStreamEntityDeclaration> *)0x648118);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->text);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->prefix);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->namespaceUri);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->qualifiedName);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->name);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->processingInstructionTarget);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->processingInstructionData);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->dtdName);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->dtdPublicId);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->dtdSystemId);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->documentVersion);
  QtPrivate::XmlStringRef::XmlStringRef(&in_RDI->documentEncoding);
  QString::QString((QString *)0x648224);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::QXmlStreamSimpleStack
            (&in_RDI->attributeStack);
  puVar2 = &in_RDI->entityParser;
  std::unique_ptr<QXmlStreamReaderPrivate,std::default_delete<QXmlStreamReaderPrivate>>::
  unique_ptr<std::default_delete<QXmlStreamReaderPrivate>,void>
            ((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *)
             in_stack_fffffffffffffc10);
  in_RDI->device = (QIODevice *)0x0;
  in_RDI->deleteDevice = false;
  in_RDI->stack_size = 0x40;
  in_RDI->sym_stack = (Value *)0x0;
  in_RDI->state_stack = (int *)0x0;
  reallocateStack(in_stack_fffffffffffffc10);
  in_RDI->entityResolver = (QXmlStreamEntityResolver *)0x0;
  init(in_RDI,ctx);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  name.m_data = (char *)pQVar3;
  name.m_size = (qsizetype)puVar2;
  value.m_data = in_stack_fffffffffffffca8;
  value.m_size = in_stack_fffffffffffffca0;
  Entity::createLiteral(name,value);
  qToStringViewIgnoringNull<QString,_true>(in_stack_fffffffffffffc18);
  pVar1 = (piter)QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::insert
                           ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)
                            in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(Entity *)0x6483bb);
  Entity::~Entity((Entity *)in_stack_fffffffffffffc10);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  name_00.m_data = (char *)pQVar3;
  name_00.m_size = (qsizetype)puVar2;
  value_00.m_data = (char *)pVar1.d;
  value_00.m_size = pVar1.bucket;
  Entity::createLiteral(name_00,value_00);
  qToStringViewIgnoringNull<QString,_true>(in_stack_fffffffffffffc18);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::insert
            ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc08,(Entity *)0x6484f2);
  Entity::~Entity((Entity *)in_stack_fffffffffffffc10);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  name_01.m_data = (char *)pQVar3;
  name_01.m_size = (qsizetype)puVar2;
  value_01.m_data = (char *)pVar1.d;
  value_01.m_size = pVar1.bucket;
  Entity::createLiteral(name_01,value_01);
  qToStringViewIgnoringNull<QString,_true>(in_stack_fffffffffffffc18);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::insert
            ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc08,(Entity *)0x648623);
  Entity::~Entity((Entity *)in_stack_fffffffffffffc10);
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  name_02.m_data = (char *)pQVar3;
  name_02.m_size = (qsizetype)puVar2;
  value_02.m_data = (char *)pVar1.d;
  value_02.m_size = pVar1.bucket;
  Entity::createLiteral(name_02,value_02);
  qToStringViewIgnoringNull<QString,_true>(in_stack_fffffffffffffc18);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::insert
            ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc08,(Entity *)0x64874e);
  Entity::~Entity((Entity *)in_stack_fffffffffffffc10);
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
  local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
  local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_148.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffffc18,(size_t)in_stack_fffffffffffffc10);
  name_03.m_data = (char *)pQVar3;
  name_03.m_size = (qsizetype)puVar2;
  value_03.m_data = (char *)pVar1.d;
  value_03.m_size = pVar1.bucket;
  Entity::createLiteral(name_03,value_03);
  this_00 = (Entity *)&in_RDI->entityHash;
  qToStringViewIgnoringNull<QString,_true>(&local_148);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::insert
            ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)this_00,
             in_stack_fffffffffffffc08,(Entity *)0x648879);
  Entity::~Entity(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QXmlStreamReaderPrivate::QXmlStreamReaderPrivate(QXmlStreamReader *q)
    :q_ptr(q)
{
    device = nullptr;
    deleteDevice = false;
    stack_size = 64;
    sym_stack = nullptr;
    state_stack = nullptr;
    reallocateStack();
    entityResolver = nullptr;
    init();
#define ADD_PREDEFINED(n, v) \
    do { \
        Entity e = Entity::createLiteral(n##_L1, v##_L1); \
        entityHash.insert(qToStringViewIgnoringNull(e.name), std::move(e)); \
    } while (false)
    ADD_PREDEFINED("lt", "<");
    ADD_PREDEFINED("gt", ">");
    ADD_PREDEFINED("amp", "&");
    ADD_PREDEFINED("apos", "'");
    ADD_PREDEFINED("quot", "\"");
#undef ADD_PREDEFINED
}